

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

_Bool container_contains(container_t *c,uint16_t val,uint8_t typecode)

{
  _Bool _Var1;
  uint uVar2;
  undefined7 in_register_00000011;
  
  uVar2 = (uint)CONCAT71(in_register_00000011,typecode);
  if (uVar2 == 4) {
    uVar2 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar2 != '\x03') {
    if ((uVar2 & 0xff) == 2) {
      _Var1 = array_container_contains((array_container_t *)c,val);
      return _Var1;
    }
    return (*(ulong *)(((array_container_t *)c)->array + (ulong)(val >> 6) * 4) >>
            ((ulong)val & 0x3f) & 1) != 0;
  }
  _Var1 = run_container_contains((run_container_t *)c,val);
  return _Var1;
}

Assistant:

static inline bool container_contains(
    const container_t *c, uint16_t val,
    uint8_t typecode  // !!! should be second argument?
) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_get(const_CAST_bitset(c), val);
        case ARRAY_CONTAINER_TYPE:
            return array_container_contains(const_CAST_array(c), val);
        case RUN_CONTAINER_TYPE:
            return run_container_contains(const_CAST_run(c), val);
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}